

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi-timeout.c
# Opt level: O2

void lws_set_timeout(lws *wsi,pending_timeout reason,int secs)

{
  int secs_00;
  lws_log_cx *plVar1;
  
  lws_dll2_remove(&(wsi->sul_timeout).list);
  if (secs == 0) {
    return;
  }
  if (secs != -2) {
    secs_00 = 0;
    if ((secs != -1) && (secs_00 = secs, (wsi->field_0x46e & 8) != 0)) {
      plVar1 = lwsl_wsi_get_cx(wsi);
      _lws_log_cx(plVar1,lws_log_prepend_wsi,wsi,1,"lws_set_timeout","on immortal stream %d %d",
                  (ulong)reason,(ulong)(uint)secs);
    }
    __lws_set_timeout(wsi,reason,secs_00);
    return;
  }
  plVar1 = lwsl_wsi_get_cx(wsi);
  _lws_log_cx(plVar1,lws_log_prepend_wsi,wsi,0x10,"lws_set_timeout","TO_KILL_SYNC");
  lws_close_free_wsi(wsi,LWS_CLOSE_STATUS_NOSTATUS,"to sync kill");
  return;
}

Assistant:

void
lws_set_timeout(struct lws *wsi, enum pending_timeout reason, int secs)
{
	struct lws_context_per_thread *pt = &wsi->a.context->pt[(int)wsi->tsi];

	lws_context_lock(pt->context, __func__);
	lws_pt_lock(pt, __func__);
	lws_dll2_remove(&wsi->sul_timeout.list);
	lws_pt_unlock(pt);

	if (!secs)
		goto bail;

	if (secs == LWS_TO_KILL_SYNC) {
		lwsl_wsi_debug(wsi, "TO_KILL_SYNC");
		lws_context_unlock(pt->context);
		lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
				   "to sync kill");
		return;
	}

	if (secs == LWS_TO_KILL_ASYNC)
		secs = 0;

	// assert(!secs || !wsi->mux_stream_immortal);
	if (secs && wsi->mux_stream_immortal)
		lwsl_wsi_err(wsi, "on immortal stream %d %d", reason, secs);

	lws_pt_lock(pt, __func__);
	__lws_set_timeout(wsi, reason, secs);
	lws_pt_unlock(pt);

bail:
	lws_context_unlock(pt->context);
}